

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyColors<cRGB555,cBGRA,bAdd>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  EBlend EVar4;
  FSpecialColormap *pFVar5;
  long lVar6;
  BYTE BVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  
  pFVar5 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_006405b0_caseD_0:
    if (0 < count) {
      lVar6 = 0;
      do {
        iVar12 = (int)((*(ushort *)pin & 0x1f) * 8 * inf->alpha +
                      (uint)pout[lVar6 * 4 + 2] * 0x10000) >> 0x10;
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        pout[lVar6 * 4 + 2] = (BYTE)iVar12;
        iVar12 = (int)((*(ushort *)pin >> 2 & 0xf8) * inf->alpha +
                      (uint)pout[lVar6 * 4 + 1] * 0x10000) >> 0x10;
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        pout[lVar6 * 4 + 1] = (BYTE)iVar12;
        iVar12 = (int)((*(ushort *)pin >> 7 & 0xf8) * inf->alpha + (uint)pout[lVar6 * 4] * 0x10000)
                 >> 0x10;
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        pout[lVar6 * 4] = (BYTE)iVar12;
        pout[lVar6 * 4 + 3] = 0xff;
        pin = (BYTE *)((long)pin + (long)step);
        lVar6 = lVar6 + 1;
      } while (count != (int)lVar6);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_006405b0_caseD_0;
    case BLEND_ICEMAP:
      if (0 < count) {
        lVar6 = 0;
        do {
          uVar3 = *(ushort *)pin;
          uVar10 = (uVar3 >> 2 & 0xf8) * 0x8f + ((uint)uVar3 * 8 & 0xff) * 0x4d +
                   (uVar3 >> 7 & 0xf8) * 0x24 >> 0xc;
          iVar12 = (uint)IcePalette[uVar10][0] * inf->alpha + (uint)pout[lVar6 * 4 + 2] * 0x10000;
          BVar7 = (BYTE)((uint)iVar12 >> 0x10);
          if (0xfe < iVar12 >> 0x10) {
            BVar7 = 0xff;
          }
          pout[lVar6 * 4 + 2] = BVar7;
          iVar12 = (uint)IcePalette[uVar10][1] * inf->alpha + (uint)pout[lVar6 * 4 + 1] * 0x10000;
          BVar7 = (BYTE)((uint)iVar12 >> 0x10);
          if (0xfe < iVar12 >> 0x10) {
            BVar7 = 0xff;
          }
          pout[lVar6 * 4 + 1] = BVar7;
          iVar12 = (uint)IcePalette[uVar10][2] * inf->alpha + (uint)pout[lVar6 * 4] * 0x10000;
          BVar7 = (BYTE)((uint)iVar12 >> 0x10);
          if (0xfe < iVar12 >> 0x10) {
            BVar7 = 0xff;
          }
          pout[lVar6 * 4] = BVar7;
          pout[lVar6 * 4 + 3] = 0xff;
          pin = (BYTE *)((long)pin + (long)step);
          lVar6 = lVar6 + 1;
        } while (count != (int)lVar6);
      }
      break;
    case BLEND_OVERLAY:
      if (0 < count) {
        lVar6 = 0;
        do {
          uVar3 = *(ushort *)pin;
          iVar12 = inf->blendcolor[3];
          iVar8 = inf->blendcolor[1];
          iVar11 = inf->blendcolor[2];
          iVar16 = (((uint)uVar3 * 8 & 0xff) * iVar12 + inf->blendcolor[0] >> 0x10 & 0xff) *
                   inf->alpha + (uint)pout[lVar6 * 4 + 2] * 0x10000;
          BVar7 = (BYTE)((uint)iVar16 >> 0x10);
          if (0xfe < iVar16 >> 0x10) {
            BVar7 = 0xff;
          }
          pout[lVar6 * 4 + 2] = BVar7;
          iVar8 = ((uVar3 >> 2 & 0xf8) * iVar12 + iVar8 >> 0x10 & 0xff) * inf->alpha +
                  (uint)pout[lVar6 * 4 + 1] * 0x10000;
          BVar7 = (BYTE)((uint)iVar8 >> 0x10);
          if (0xfe < iVar8 >> 0x10) {
            BVar7 = 0xff;
          }
          pout[lVar6 * 4 + 1] = BVar7;
          iVar12 = ((uVar3 >> 7 & 0xf8) * iVar12 + iVar11 >> 0x10 & 0xff) * inf->alpha +
                   (uint)pout[lVar6 * 4] * 0x10000;
          BVar7 = (BYTE)((uint)iVar12 >> 0x10);
          if (0xfe < iVar12 >> 0x10) {
            BVar7 = 0xff;
          }
          pout[lVar6 * 4] = BVar7;
          pout[lVar6 * 4 + 3] = 0xff;
          pin = (BYTE *)((long)pin + (long)step);
          lVar6 = lVar6 + 1;
        } while (count != (int)lVar6);
      }
      break;
    case BLEND_MODULATE:
      if (0 < count) {
        lVar6 = 0;
        do {
          uVar3 = *(ushort *)pin;
          iVar12 = (int)((((uint)uVar3 * 8 & 0xff) * inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha
                        + (uint)pout[lVar6 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          iVar8 = inf->blendcolor[1];
          iVar11 = inf->blendcolor[2];
          pout[lVar6 * 4 + 2] = (BYTE)iVar12;
          iVar12 = (int)(((uVar3 >> 2 & 0xf8) * iVar8 >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar6 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          pout[lVar6 * 4 + 1] = (BYTE)iVar12;
          iVar12 = (int)(((uVar3 >> 7 & 0xf8) * iVar11 >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar6 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          pout[lVar6 * 4] = (BYTE)iVar12;
          pout[lVar6 * 4 + 3] = 0xff;
          pin = (BYTE *)((long)pin + (long)step);
          lVar6 = lVar6 + 1;
        } while (count != (int)lVar6);
      }
      break;
    default:
      EVar4 = inf->blend;
      lVar6 = (long)EVar4;
      if (lVar6 < 0x21) {
        if ((BLEND_ICEMAP < EVar4) && (0 < count)) {
          iVar12 = 0x20 - EVar4;
          lVar6 = 0;
          do {
            uVar3 = *(ushort *)pin;
            uVar15 = (uint)uVar3 * 8 & 0xff;
            uVar10 = uVar3 >> 2 & 0xf8;
            uVar13 = uVar3 >> 7 & 0xf8;
            iVar8 = (uVar10 * 0x8f + uVar15 * 0x4d + uVar13 * 0x24 >> 8) * (EVar4 + BLEND_MODULATE);
            iVar16 = uVar15 * iVar12 + iVar8;
            iVar11 = uVar10 * iVar12 + iVar8;
            iVar8 = uVar13 * iVar12 + iVar8;
            iVar16 = ((uint)((ulong)((long)iVar16 * 0x84210843) >> 0x24) - (iVar16 >> 0x1f) & 0xff)
                     * inf->alpha + (uint)pout[lVar6 * 4 + 2] * 0x10000;
            BVar7 = (BYTE)((uint)iVar16 >> 0x10);
            if (0xfe < iVar16 >> 0x10) {
              BVar7 = 0xff;
            }
            pout[lVar6 * 4 + 2] = BVar7;
            iVar11 = ((uint)((ulong)((long)iVar11 * 0x84210843) >> 0x24) - (iVar11 >> 0x1f) & 0xff)
                     * inf->alpha + (uint)pout[lVar6 * 4 + 1] * 0x10000;
            BVar7 = (BYTE)((uint)iVar11 >> 0x10);
            if (0xfe < iVar11 >> 0x10) {
              BVar7 = 0xff;
            }
            pout[lVar6 * 4 + 1] = BVar7;
            iVar8 = ((uint)((ulong)((long)iVar8 * 0x84210843) >> 0x24) - (iVar8 >> 0x1f) & 0xff) *
                    inf->alpha + (uint)pout[lVar6 * 4] * 0x10000;
            BVar7 = (BYTE)((uint)iVar8 >> 0x10);
            if (0xfe < iVar8 >> 0x10) {
              BVar7 = 0xff;
            }
            pout[lVar6 * 4] = BVar7;
            pout[lVar6 * 4 + 3] = 0xff;
            pin = (BYTE *)((long)pin + (long)step);
            lVar6 = lVar6 + 1;
          } while (count != (int)lVar6);
        }
      }
      else if (0 < count) {
        lVar9 = 0;
        do {
          uVar3 = *(ushort *)pin;
          uVar14 = (ulong)((uVar3 >> 2 & 0xf8) * 0x8f + ((uint)uVar3 * 8 & 0xff) * 0x4d +
                           (uVar3 >> 7 & 0xf8) * 0x24 >> 8);
          bVar1 = *(byte *)((long)pFVar5 + uVar14 * 4 + lVar6 * 0x518 + -0xa700);
          bVar2 = *(byte *)((long)pFVar5 + uVar14 * 4 + lVar6 * 0x518 + -0xa6ff);
          iVar12 = (uint)*(byte *)((long)pFVar5 + uVar14 * 4 + lVar6 * 0x518 + -0xa6fe) * inf->alpha
                   + (uint)pout[lVar9 * 4 + 2] * 0x10000;
          BVar7 = (BYTE)((uint)iVar12 >> 0x10);
          if (0xfe < iVar12 >> 0x10) {
            BVar7 = 0xff;
          }
          pout[lVar9 * 4 + 2] = BVar7;
          iVar12 = (uint)bVar2 * inf->alpha + (uint)pout[lVar9 * 4 + 1] * 0x10000;
          BVar7 = (BYTE)((uint)iVar12 >> 0x10);
          if (0xfe < iVar12 >> 0x10) {
            BVar7 = 0xff;
          }
          pout[lVar9 * 4 + 1] = BVar7;
          iVar12 = (uint)bVar1 * inf->alpha + (uint)pout[lVar9 * 4] * 0x10000;
          BVar7 = (BYTE)((uint)iVar12 >> 0x10);
          if (0xfe < iVar12 >> 0x10) {
            BVar7 = 0xff;
          }
          pout[lVar9 * 4] = BVar7;
          pout[lVar9 * 4 + 3] = 0xff;
          pin = (BYTE *)((long)pin + (long)step);
          lVar9 = lVar9 + 1;
        } while (count != (int)lVar9);
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}